

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tiny_obj_loader.h
# Opt level: O0

bool tinyobj::LoadObj(attrib_t *attrib,
                     vector<tinyobj::shape_t,_std::allocator<tinyobj::shape_t>_> *shapes,
                     vector<tinyobj::material_t,_std::allocator<tinyobj::material_t>_> *materials,
                     string *warn,string *err,char *filename,char *mtl_basedir,bool trianglulate,
                     bool default_vcols_fallback)

{
  byte bVar1;
  ostream *poVar2;
  ulong uVar3;
  char *pcVar4;
  char *local_4a0;
  undefined1 local_460 [8];
  MaterialFileReader matFileReader;
  undefined1 local_430 [6];
  char dirsep;
  string baseDir;
  string local_408 [48];
  long local_3d8;
  ifstream ifs;
  stringstream local_1d0 [8];
  stringstream errss;
  ostream local_1c0 [382];
  byte local_42;
  byte local_41;
  bool default_vcols_fallback_local;
  char *pcStack_40;
  bool trianglulate_local;
  char *filename_local;
  string *err_local;
  string *warn_local;
  vector<tinyobj::material_t,_std::allocator<tinyobj::material_t>_> *materials_local;
  vector<tinyobj::shape_t,_std::allocator<tinyobj::shape_t>_> *shapes_local;
  attrib_t *attrib_local;
  
  local_41 = trianglulate;
  local_42 = default_vcols_fallback;
  pcStack_40 = filename;
  filename_local = (char *)err;
  err_local = warn;
  warn_local = (string *)materials;
  materials_local = (vector<tinyobj::material_t,_std::allocator<tinyobj::material_t>_> *)shapes;
  shapes_local = (vector<tinyobj::shape_t,_std::allocator<tinyobj::shape_t>_> *)attrib;
  std::vector<float,_std::allocator<float>_>::clear(&attrib->vertices);
  std::vector<float,_std::allocator<float>_>::clear
            ((vector<float,_std::allocator<float>_> *)(shapes_local + 2));
  std::vector<float,_std::allocator<float>_>::clear
            ((vector<float,_std::allocator<float>_> *)(shapes_local + 3));
  std::vector<float,_std::allocator<float>_>::clear
            ((vector<float,_std::allocator<float>_> *)(shapes_local + 5));
  std::vector<tinyobj::shape_t,_std::allocator<tinyobj::shape_t>_>::clear
            ((vector<tinyobj::shape_t,_std::allocator<tinyobj::shape_t>_> *)materials_local);
  std::__cxx11::stringstream::stringstream(local_1d0);
  std::ifstream::ifstream(&local_3d8,pcStack_40,_S_in);
  bVar1 = std::ios::operator!((ios *)((long)&local_3d8 + *(long *)(local_3d8 + -0x18)));
  if ((bVar1 & 1) == 0) {
    if (mtl_basedir == (char *)0x0) {
      local_4a0 = "";
    }
    else {
      local_4a0 = mtl_basedir;
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)local_430,local_4a0,
               (allocator *)(matFileReader.m_mtlBaseDir.field_2._M_local_buf + 0xf));
    std::allocator<char>::~allocator
              ((allocator<char> *)(matFileReader.m_mtlBaseDir.field_2._M_local_buf + 0xf));
    uVar3 = std::__cxx11::string::empty();
    if ((uVar3 & 1) == 0) {
      matFileReader.m_mtlBaseDir.field_2._M_local_buf[0xe] = '/';
      std::__cxx11::string::length();
      pcVar4 = (char *)std::__cxx11::string::operator[]((ulong)local_430);
      if (*pcVar4 != '/') {
        std::__cxx11::string::operator+=((string *)local_430,'/');
      }
    }
    MaterialFileReader::MaterialFileReader((MaterialFileReader *)local_460,(string *)local_430);
    attrib_local._7_1_ =
         LoadObj((attrib_t *)shapes_local,
                 (vector<tinyobj::shape_t,_std::allocator<tinyobj::shape_t>_> *)materials_local,
                 (vector<tinyobj::material_t,_std::allocator<tinyobj::material_t>_> *)warn_local,
                 err_local,(string *)filename_local,(istream *)&local_3d8,
                 (MaterialReader *)local_460,(bool)(local_41 & 1),(bool)(local_42 & 1));
    baseDir.field_2._12_4_ = 1;
    MaterialFileReader::~MaterialFileReader((MaterialFileReader *)local_460);
    std::__cxx11::string::~string((string *)local_430);
  }
  else {
    poVar2 = std::operator<<(local_1c0,"Cannot open file [");
    poVar2 = std::operator<<(poVar2,pcStack_40);
    poVar2 = std::operator<<(poVar2,"]");
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    if (filename_local != (char *)0x0) {
      std::__cxx11::stringstream::str();
      std::__cxx11::string::operator=((string *)filename_local,local_408);
      std::__cxx11::string::~string(local_408);
    }
    attrib_local._7_1_ = 0;
    baseDir.field_2._12_4_ = 1;
  }
  std::ifstream::~ifstream(&local_3d8);
  std::__cxx11::stringstream::~stringstream(local_1d0);
  return (bool)(attrib_local._7_1_ & 1);
}

Assistant:

bool LoadObj(attrib_t *attrib, std::vector<shape_t> *shapes,
             std::vector<material_t> *materials, std::string *warn,
             std::string *err, const char *filename, const char *mtl_basedir,
             bool trianglulate, bool default_vcols_fallback) {
  attrib->vertices.clear();
  attrib->normals.clear();
  attrib->texcoords.clear();
  attrib->colors.clear();
  shapes->clear();

  std::stringstream errss;

  std::ifstream ifs(filename);
  if (!ifs) {
    errss << "Cannot open file [" << filename << "]" << std::endl;
    if (err) {
      (*err) = errss.str();
    }
    return false;
  }

  std::string baseDir = mtl_basedir ? mtl_basedir : "";
  if (!baseDir.empty()) {
#ifndef _WIN32
    const char dirsep = '/';
#else
    const char dirsep = '\\';
#endif
    if (baseDir[baseDir.length() - 1] != dirsep) baseDir += dirsep;
  }
  MaterialFileReader matFileReader(baseDir);

  return LoadObj(attrib, shapes, materials, warn, err, &ifs, &matFileReader,
                 trianglulate, default_vcols_fallback);
}